

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void * google::protobuf::internal::NewStringElement(Arena *arena)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Arena *arena_local;
  
  pbVar1 = Arena::Create<std::__cxx11::string>(arena);
  return pbVar1;
}

Assistant:

void* NewStringElement(Arena* arena) {
  return Arena::Create<std::string>(arena);
}